

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::panic(VirtualMachine *this,string *message)

{
  ostream *poVar1;
  string *message_local;
  VirtualMachine *this_local;
  
  if ((this->isPanicing & 1U) != 0) {
    poVar1 = std::operator<<(this->out,"RECURSIVE CALL TO PANIC, JUST EXITING!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  this->isPanicing = true;
  poVar1 = std::operator<<(this->out,"PANIC!: ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"\n");
  print(this);
  exit(1);
}

Assistant:

[[noreturn]]
void runtime::VirtualMachine::panic(const std::string & message) {
  if (this->isPanicing) {
    this->out << "RECURSIVE CALL TO PANIC, JUST EXITING!" << std::endl;
    exit(1);
  }

  this->isPanicing = true;

  this->out << "PANIC!: " << message << "\n";

  this->print();

  exit(1);
}